

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

void testing::internal::TuplePrefix<2ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<std::vector<char,std::allocator<char>>const&>,testing::Matcher<unsigned_long>>,std::tuple<std::vector<char,std::allocator<char>>const&,unsigned_long>>
               (tuple<testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_long>_>
                *matchers,
               tuple<const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long> *values,
               ostream *os)

{
  bool bVar1;
  ostream *poVar2;
  type matcher;
  string local_1d0;
  StringMatchResultListener listener;
  
  TuplePrefix<1ul>::
  ExplainMatchFailuresTo<std::tuple<testing::Matcher<std::vector<char,std::allocator<char>>const&>,testing::Matcher<unsigned_long>>,std::tuple<std::vector<char,std::allocator<char>>const&,unsigned_long>>
            (matchers,values,os);
  Matcher<unsigned_long>::Matcher(&matcher,(Matcher<unsigned_long> *)matchers);
  StringMatchResultListener::StringMatchResultListener(&listener);
  bVar1 = MatcherBase<unsigned_long>::MatchAndExplain
                    (&matcher.super_MatcherBase<unsigned_long>,(unsigned_long *)values,
                     &listener.super_MatchResultListener);
  if (!bVar1) {
    poVar2 = std::operator<<(os,"  Expected arg #");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,": ");
    MatcherBase<unsigned_long>::DescribeTo((MatcherBase<unsigned_long> *)matchers,os);
    std::operator<<(os,"\n           Actual: ");
    internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
    PrintValue<unsigned_long,void,std::ostream&>((unsigned_long *)values,os);
    std::__cxx11::stringbuf::str();
    PrintIfNotEmpty(&local_1d0,os);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::operator<<(os,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener(&listener);
  MatcherBase<unsigned_long>::~MatcherBase(&matcher.super_MatcherBase<unsigned_long>);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename std::tuple_element<N - 1, MatcherTuple>::type matcher =
        std::get<N - 1>(matchers);
    typedef typename std::tuple_element<N - 1, ValueTuple>::type Value;
    const Value& value = std::get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      *os << "  Expected arg #" << N - 1 << ": ";
      std::get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }